

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O0

void __thiscall RenX_ChatLogPlugin::PrepFile(RenX_ChatLogPlugin *this)

{
  __type _Var1;
  byte bVar2;
  char *pcVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string file_name;
  string local_68 [8];
  string full_date;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string current_date;
  RenX_ChatLogPlugin *this_local;
  
  current_date.field_2._8_8_ = this;
  pcVar3 = (char *)getTimeFormat("%F");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,pcVar3,&local_31);
  std::allocator<char>::~allocator(&local_31);
  pcVar3 = (char *)getTimeFormat("%c");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,pcVar3,(allocator<char> *)(file_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(file_name.field_2._M_local_buf + 0xf));
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,&this->last_date);
  if (_Var1) {
    file_name.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->last_date,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    bVar2 = std::fstream::is_open();
    if ((bVar2 & 1) != 0) {
      std::fstream::close();
    }
    std::operator+(&local_b0,"ChatLog_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   &local_b0,".log");
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator|(_S_out,_S_app);
    std::fstream::open((string *)&this->fs,(_Ios_Openmode)local_90);
    poVar4 = std::operator<<((ostream *)&this->field_0xd0,"Session Start: ");
    poVar4 = std::operator<<(poVar4,local_68);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_90);
    file_name.field_2._8_4_ = 0;
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void RenX_ChatLogPlugin::PrepFile()
{
	// Check if date changed (Format: YYYY-MM-DD)
	std::string current_date = getTimeFormat("%F");
	std::string full_date = getTimeFormat("%c");

	if (current_date == last_date) {
		return;
	}

	last_date = current_date;

	// Close any currently opened file

	if (fs.is_open()) {
		fs.close();
	}

	// Open new file

	std::string file_name = "ChatLog_" + current_date + ".log";
	fs.open(file_name, std::fstream::out | std::fstream::app);

	fs << "Session Start: "
		<< full_date
		<< std::endl;
}